

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cfg.cpp
# Opt level: O0

void __thiscall diligent_spirv_cross::CFG::build_post_order_visit_order(CFG *this)

{
  uint32_t block_id;
  uint32_t block;
  CFG *this_local;
  
  block_id = TypedID::operator_cast_to_unsigned_int((TypedID *)&this->func->entry_block);
  this->visit_count = 0;
  ::std::
  unordered_map<unsigned_int,_diligent_spirv_cross::CFG::VisitOrder,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_diligent_spirv_cross::CFG::VisitOrder>_>_>
  ::clear(&this->visit_order);
  SmallVector<unsigned_int,_8UL>::clear(&this->post_order);
  post_order_visit(this,block_id);
  return;
}

Assistant:

void CFG::build_post_order_visit_order()
{
	uint32_t block = func.entry_block;
	visit_count = 0;
	visit_order.clear();
	post_order.clear();
	post_order_visit(block);
}